

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint zlib_decompress(uchar **out,size_t *outsize,size_t expected_size,uchar *in,size_t insize,
                    LodePNGDecompressSettings *settings)

{
  undefined1 local_60 [8];
  ucvector v;
  uint error;
  LodePNGDecompressSettings *settings_local;
  size_t insize_local;
  uchar *in_local;
  size_t expected_size_local;
  size_t *outsize_local;
  uchar **out_local;
  
  if (settings->custom_zlib ==
      (_func_uint_uchar_ptr_ptr_size_t_ptr_uchar_ptr_size_t_LodePNGDecompressSettings_ptr *)0x0) {
    ucvector_init((ucvector *)local_60,*out,*outsize);
    if (expected_size != 0) {
      ucvector_resize((ucvector *)local_60,*outsize + expected_size);
      v.data = (uchar *)*outsize;
    }
    out_local._4_4_ = lodepng_zlib_decompressv((ucvector *)local_60,in,insize,settings);
    *out = (uchar *)local_60;
    *outsize = (size_t)v.data;
  }
  else {
    out_local._4_4_ = (*settings->custom_zlib)(out,outsize,in,insize,settings);
  }
  return out_local._4_4_;
}

Assistant:

static unsigned zlib_decompress(unsigned char** out, size_t* outsize, size_t expected_size,
                                const unsigned char* in, size_t insize, const LodePNGDecompressSettings* settings) {
  if(settings->custom_zlib) {
    return settings->custom_zlib(out, outsize, in, insize, settings);
  } else {
    unsigned error;
    ucvector v = ucvector_init(*out, *outsize);
    if(expected_size) {
      /*reserve the memory to avoid intermediate reallocations*/
      ucvector_resize(&v, *outsize + expected_size);
      v.size = *outsize;
    }
    error = lodepng_zlib_decompressv(&v, in, insize, settings);
    *out = v.data;
    *outsize = v.size;
    return error;
  }
}